

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

QScroller * __thiscall
QMap<QObject_*,_QScroller_*>::value
          (QMap<QObject_*,_QScroller_*> *this,QObject **key,QScroller **defaultValue)

{
  QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>
  *pQVar1;
  QObject *pQVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>
                  *)0x0) &&
     (p_Var4 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8),
     p_Var4 != (_Base_ptr)0x0)) {
    p_Var3 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
    pQVar2 = *key;
    p_Var5 = &p_Var3->_M_header;
    do {
      if (*(QObject **)(p_Var4 + 1) >= pQVar2) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(QObject **)(p_Var4 + 1) < pQVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var3) && (*(QObject **)(p_Var5 + 1) <= pQVar2)) {
      defaultValue = (QScroller **)&p_Var5[1]._M_parent;
    }
  }
  return (QScroller *)(_Base_ptr)*defaultValue;
}

Assistant:

constexpr P get() const noexcept { return ptr; }